

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O3

void duckdb::Exception::SetQueryLocation
               (optional_idx error_location,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *extra_info)

{
  bool bVar1;
  char cVar2;
  idx_t __val;
  mapped_type *this;
  idx_t iVar3;
  char cVar4;
  string __str;
  optional_idx local_68;
  key_type local_60;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  if (error_location.index != 0xffffffffffffffff) {
    local_68.index = error_location.index;
    __val = optional_idx::GetIndex(&local_68);
    cVar4 = '\x01';
    if (9 < __val) {
      iVar3 = __val;
      cVar2 = '\x04';
      do {
        cVar4 = cVar2;
        if (iVar3 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00e51c6f;
        }
        if (iVar3 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00e51c6f;
        }
        if (iVar3 < 10000) goto LAB_00e51c6f;
        bVar1 = 99999 < iVar3;
        iVar3 = iVar3 / 10000;
        cVar2 = cVar4 + '\x04';
      } while (bVar1);
      cVar4 = cVar4 + '\x01';
    }
LAB_00e51c6f:
    local_40 = local_30;
    ::std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_40,local_38,__val);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"position","");
    this = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)extra_info,&local_60);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void Exception::SetQueryLocation(optional_idx error_location, unordered_map<string, string> &extra_info) {
	if (error_location.IsValid()) {
		extra_info["position"] = to_string(error_location.GetIndex());
	}
}